

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::Options
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,RegexFlags *flags)

{
  StandardChars<unsigned_char> *pSVar1;
  CharCount n;
  byte bVar2;
  EncodedChar EVar3;
  RegexFlags RVar4;
  bool bVar5;
  Char c;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ThreadConfiguration *pTVar10;
  
  do {
    bVar2 = ECLookahead(this,0);
    c = (Char)bVar2;
    if (bVar2 == 0x5c) {
      if ((this->inputLim < this->next + 6) || (EVar3 = ECLookahead(this,1), EVar3 != 'u'))
      goto LAB_00d3864f;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,2);
      bVar5 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
      if (!bVar5) goto LAB_00d3864f;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,3);
      bVar5 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
      if (!bVar5) goto LAB_00d3864f;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,4);
      bVar5 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
      if (!bVar5) goto LAB_00d3864f;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,5);
      bVar5 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
      if (!bVar5) goto LAB_00d3864f;
      if (((this->scriptContext->config).threadConfig)->m_ES6Unicode != false) goto LAB_00d3876d;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,2);
      uVar6 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,3);
      uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,4);
      uVar8 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,5);
      uVar9 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      c = Chars<char16_t>::UTC(uVar8 << 4 | uVar9 | uVar6 << 0xc | uVar7 << 8);
      n = 6;
    }
    else {
      if (bVar2 == 0) {
        return;
      }
LAB_00d3864f:
      n = 1;
    }
    switch((ushort)c - 0x67 >> 1 | (uint)(((ushort)c - 0x67 & 1) != 0) << 0x1f) {
    case 0:
      RVar4 = *flags;
      if ((RVar4 & GlobalRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | GlobalRegexFlag;
      break;
    case 1:
      RVar4 = *flags;
      if ((RVar4 & IgnoreCaseRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | IgnoreCaseRegexFlag;
      break;
    default:
switchD_00d3866d_caseD_2:
      bVar5 = StandardChars<char16_t>::IsWord(this->standardChars,c);
      if (!bVar5) {
        return;
      }
LAB_00d3876d:
      Fail(this,-0x7ff5ec67);
      return;
    case 3:
      RVar4 = *flags;
      if ((RVar4 & MultilineRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | MultilineRegexFlag;
      break;
    case 6:
      pTVar10 = (this->scriptContext->config).threadConfig;
      if (pTVar10->m_ES2018RegExDotAll != true) goto LAB_00d3870d;
      RVar4 = *flags;
      if ((RVar4 & DotAllRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | DotAllRegexFlag;
      break;
    case 7:
      pTVar10 = (this->scriptContext->config).threadConfig;
LAB_00d3870d:
      if (pTVar10->m_ES6Unicode != true) goto LAB_00d3872e;
      RVar4 = *flags;
      if ((RVar4 & UnicodeRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | UnicodeRegexFlag;
      break;
    case 9:
      pTVar10 = (this->scriptContext->config).threadConfig;
LAB_00d3872e:
      if (pTVar10->m_ES6RegExSticky != true) goto switchD_00d3866d_caseD_2;
      RVar4 = *flags;
      if ((RVar4 & StickyRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar4 = *flags;
      }
      RVar4 = RVar4 | StickyRegexFlag;
    }
    *flags = RVar4;
    ECConsume(this,n);
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }